

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O1

size_t HUF_decompress1X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2)

{
  undefined1 *puVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  ulong *puVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong *puVar10;
  uint uVar11;
  bool bVar12;
  
  if (bmi2 != 0) {
    if (cSrcSize == 0) {
      cSrcSize = 0xffffffffffffffb8;
      uVar3 = 0;
      uVar6 = 0;
      puVar10 = (ulong *)0x0;
      cSrc = (ulong *)0x0;
      puVar5 = (ulong *)0x0;
    }
    else {
      puVar5 = (ulong *)((long)cSrc + 8);
      if (cSrcSize < 8) {
        uVar6 = (ulong)*cSrc;
        switch(cSrcSize) {
        case 7:
          uVar6 = uVar6 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
        case 6:
          uVar6 = uVar6 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
        case 5:
          uVar6 = uVar6 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
        case 4:
          uVar6 = uVar6 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
        case 3:
          uVar6 = uVar6 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
        case 2:
          uVar6 = uVar6 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
        default:
          bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
          uVar2 = 0x1f;
          if (bVar4 != 0) {
            for (; bVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
            }
          }
          if (bVar4 == 0) {
            cSrcSize = 0xffffffffffffffec;
            uVar2 = 0;
          }
          else {
            uVar2 = ~uVar2 + (int)cSrcSize * -8 + 0x49;
          }
          uVar3 = (ulong)uVar2;
          puVar10 = (ulong *)cSrc;
        }
      }
      else {
        puVar10 = (ulong *)((long)cSrc + (cSrcSize - 8));
        uVar6 = *puVar10;
        bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar2 = 0x1f;
        if (bVar4 != 0) {
          for (; bVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        uVar2 = ~uVar2 + 9;
        if (bVar4 == 0) {
          uVar2 = 0;
        }
        uVar3 = (ulong)uVar2;
        cSrcSize = cSrcSize | -(ulong)(bVar4 == 0);
      }
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    puVar1 = (undefined1 *)((long)dst + dstSize);
    uVar2 = -(uint)*(ushort *)((long)DTable + 2) & 0x3f;
    do {
      uVar11 = (uint)uVar3;
      if (uVar11 < 0x41) {
        if (puVar10 < puVar5) {
          if (puVar10 == (ulong *)cSrc) goto LAB_0015907f;
          bVar12 = cSrc <= (ulong *)((long)puVar10 - (uVar3 >> 3));
          uVar7 = (int)puVar10 - (int)cSrc;
          if (bVar12) {
            uVar7 = (uint)(uVar3 >> 3);
          }
          uVar11 = uVar11 + uVar7 * -8;
        }
        else {
          uVar7 = (uint)(uVar3 >> 3);
          uVar11 = uVar11 & 7;
          bVar12 = true;
        }
        uVar3 = (ulong)uVar11;
        puVar10 = (ulong *)((long)puVar10 - (ulong)uVar7);
        uVar6 = *puVar10;
      }
      else {
LAB_0015907f:
        bVar12 = false;
      }
      uVar11 = (uint)uVar3;
      if ((puVar1 + -3 <= dst) || (!bVar12)) {
        for (; dst < puVar1; dst = (void *)((long)dst + 1)) {
          uVar9 = (uVar6 << (uVar3 & 0x3f)) >> uVar2;
          uVar11 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + (int)uVar3;
          *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
          uVar3 = (ulong)uVar11;
        }
        if (uVar11 != 0x40) {
          dstSize = 0xffffffffffffffec;
        }
        if (puVar10 != (ulong *)cSrc) {
          dstSize = 0xffffffffffffffec;
        }
        return dstSize;
      }
      uVar3 = (uVar6 << (uVar3 & 0x3f)) >> uVar2;
      uVar11 = *(byte *)((long)DTable + uVar3 * 2 + 5) + uVar11;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar3 * 2 + 4);
      uVar3 = (uVar6 << ((ulong)uVar11 & 0x3f)) >> uVar2;
      uVar11 = *(byte *)((long)DTable + uVar3 * 2 + 5) + uVar11;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar3 * 2 + 4);
      uVar3 = (uVar6 << ((ulong)uVar11 & 0x3f)) >> uVar2;
      uVar11 = *(byte *)((long)DTable + uVar3 * 2 + 5) + uVar11;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar3 * 2 + 4);
      uVar9 = (uVar6 << ((ulong)uVar11 & 0x3f)) >> uVar2;
      uVar3 = (ulong)(*(byte *)((long)DTable + uVar9 * 2 + 5) + uVar11);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
      dst = (void *)((long)dst + 4);
    } while( true );
  }
  if (cSrcSize == 0) {
    cSrcSize = 0xffffffffffffffb8;
    uVar3 = 0;
    uVar6 = 0;
    puVar10 = (ulong *)0x0;
    cSrc = (ulong *)0x0;
    puVar5 = (ulong *)0x0;
  }
  else {
    puVar5 = (ulong *)((long)cSrc + 8);
    if (cSrcSize < 8) {
      uVar6 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar6 = uVar6 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar6 = uVar6 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar6 = uVar6 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar6 = uVar6 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar6 = uVar6 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar6 = uVar6 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar2 = 0x1f;
        if (bVar4 != 0) {
          for (; bVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        if (bVar4 == 0) {
          cSrcSize = 0xffffffffffffffec;
          uVar2 = 0;
        }
        else {
          uVar2 = ~uVar2 + (int)cSrcSize * -8 + 0x49;
        }
        uVar3 = (ulong)uVar2;
        puVar10 = (ulong *)cSrc;
      }
    }
    else {
      puVar10 = (ulong *)((long)cSrc + (cSrcSize - 8));
      uVar6 = *puVar10;
      bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar2 = 0x1f;
      if (bVar4 != 0) {
        for (; bVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = ~uVar2 + 9;
      if (bVar4 == 0) {
        uVar2 = 0;
      }
      uVar3 = (ulong)uVar2;
      cSrcSize = cSrcSize | -(ulong)(bVar4 == 0);
    }
  }
  if (0xffffffffffffff88 < cSrcSize) {
    return cSrcSize;
  }
  puVar1 = (undefined1 *)((long)dst + dstSize);
  bVar4 = -(char)*(undefined2 *)((long)DTable + 2) & 0x3f;
  do {
    uVar2 = (uint)uVar3;
    if (uVar2 < 0x41) {
      if (puVar10 < puVar5) {
        if (puVar10 == (ulong *)cSrc) goto LAB_00154fe6;
        bVar12 = cSrc <= (ulong *)((long)puVar10 - (uVar3 >> 3));
        uVar11 = (int)puVar10 - (int)cSrc;
        if (bVar12) {
          uVar11 = (uint)(uVar3 >> 3);
        }
        uVar2 = uVar2 + uVar11 * -8;
      }
      else {
        uVar11 = (uint)(uVar3 >> 3);
        uVar2 = uVar2 & 7;
        bVar12 = true;
      }
      uVar3 = (ulong)uVar2;
      puVar10 = (ulong *)((long)puVar10 - (ulong)uVar11);
      uVar6 = *puVar10;
    }
    else {
LAB_00154fe6:
      bVar12 = false;
    }
    if ((puVar1 + -3 <= dst) || (!bVar12)) {
      for (; dst < puVar1; dst = (void *)((long)dst + 1)) {
        uVar9 = (uVar6 << ((byte)uVar3 & 0x3f)) >> bVar4;
        uVar3 = (ulong)((int)uVar3 + (uint)*(byte *)((long)DTable + uVar9 * 2 + 5));
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
      }
      if ((int)uVar3 != 0x40) {
        dstSize = 0xffffffffffffffec;
      }
      if (puVar10 != (ulong *)cSrc) {
        dstSize = 0xffffffffffffffec;
      }
      return dstSize;
    }
    uVar9 = (uVar6 << ((byte)uVar3 & 0x3f)) >> bVar4;
    iVar8 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + (int)uVar3;
    uVar3 = (uVar6 << ((byte)iVar8 & 0x3f)) >> bVar4;
    *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    iVar8 = (uint)*(byte *)((long)DTable + uVar3 * 2 + 5) + iVar8;
    uVar9 = (uVar6 << ((byte)iVar8 & 0x3f)) >> bVar4;
    *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar3 * 2 + 4);
    iVar8 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + iVar8;
    *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    uVar9 = (uVar6 << ((byte)iVar8 & 0x3f)) >> bVar4;
    uVar3 = (ulong)((uint)*(byte *)((long)DTable + uVar9 * 2 + 5) + iVar8);
    *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar9 * 2 + 4);
    dst = (void *)((long)dst + 4);
  } while( true );
}

Assistant:

HUF_DGEN(HUF_decompress1X1_usingDTable_internal)
HUF_DGEN(HUF_decompress4X1_usingDTable_internal)



size_t HUF_decompress1X1_usingDTable(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    if (dtd.tableType != 0) return ERROR(GENERIC);
    return HUF_decompress1X1_usingDTable_internal(dst, dstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
}